

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O1

void __thiscall
perfetto::protos::gen::StatsdPullAtomConfig::~StatsdPullAtomConfig(StatsdPullAtomConfig *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  pointer piVar3;
  pointer pAVar4;
  
  (this->super_CppMessageObj)._vptr_CppMessageObj =
       (_func_int **)&PTR__StatsdPullAtomConfig_003c7778;
  pcVar2 = (this->unknown_fields_)._M_dataplus._M_p;
  paVar1 = &(this->unknown_fields_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->packages_);
  piVar3 = (this->raw_pull_atom_id_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (piVar3 != (pointer)0x0) {
    operator_delete(piVar3,(long)(this->raw_pull_atom_id_).
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)piVar3);
  }
  pAVar4 = (this->pull_atom_id_).
           super__Vector_base<perfetto::protos::gen::AtomId,_std::allocator<perfetto::protos::gen::AtomId>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pAVar4 != (pointer)0x0) {
    operator_delete(pAVar4,(long)(this->pull_atom_id_).
                                 super__Vector_base<perfetto::protos::gen::AtomId,_std::allocator<perfetto::protos::gen::AtomId>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pAVar4);
    return;
  }
  return;
}

Assistant:

StatsdPullAtomConfig::~StatsdPullAtomConfig() = default;